

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall
HBT_correlation::combine_and_bin_particle_pairs
          (HBT_correlation *this,vector<int,_std::allocator<int>_> *event_list)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  long lVar17;
  int iVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  double dVar22;
  double dVar23;
  double __x;
  double __y;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  pretty_ostream *this_00;
  string *type;
  double cos_qx;
  double delta_phi;
  double local_K_phi;
  int Kphi_idx;
  int qlong_idx;
  double boost_beta;
  double boost_gamma;
  double Mt;
  double local_q_long;
  int qside_idx;
  double local_q_side;
  int qout_idx;
  double local_q_out;
  double sin_K_phi;
  double cos_K_phi;
  double cos_qx_1;
  int qinv_idx;
  double z_diff;
  double y_diff;
  double x_diff;
  double t_diff;
  double local_q_inv;
  double q_E;
  double q_z;
  double q_y;
  double q_x;
  int Kperp_idx;
  double K_perp;
  double K_perp_sq;
  double K_y;
  double K_x;
  double K_z_over_K_E;
  double K_E;
  double K_z;
  double particle_2_t;
  double particle_2_z;
  double particle_2_y;
  double particle_2_x;
  double particle_2_E;
  double particle_2_pz;
  double particle_2_py;
  double particle_2_px;
  int j_1;
  double particle_1_t;
  double particle_1_z;
  double particle_1_y;
  double particle_1_x;
  double particle_1_E;
  double particle_1_pz;
  double particle_1_py;
  double particle_1_px;
  int i_1;
  double KT_max_sq;
  double KT_min_sq;
  unsigned_long_long number_of_pairs;
  longlong number_of_particles;
  particle_info temp_particle;
  double temp_ratio;
  double temp_pz;
  double temp_E;
  int i;
  int event_number_particle;
  int event_id;
  int j;
  double particle_list_rapidity_cut_min;
  double particle_list_rapidity_cut_max;
  vector<particle_info,_std::allocator<particle_info>_> temp_particle_list;
  double hbarC_inv;
  char (*in_stack_fffffffffffff868) [31];
  particleSamples *in_stack_fffffffffffff870;
  value_type *in_stack_fffffffffffff878;
  particleSamples *in_stack_fffffffffffff880;
  undefined1 local_721 [33];
  double local_700;
  double local_6f8;
  int local_6f0;
  int local_6ec;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  int local_6c4;
  double local_6c0;
  int local_6b4;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  int local_68c;
  double local_688;
  double local_680;
  string *in_stack_fffffffffffff988;
  pretty_ostream *in_stack_fffffffffffff990;
  int local_5bc;
  int local_574;
  allocator local_559;
  string local_558 [32];
  long local_538;
  size_type local_530;
  undefined8 local_4d8;
  undefined8 local_468;
  undefined8 local_3f8;
  undefined8 local_388;
  undefined8 local_340;
  undefined8 local_2b0;
  undefined8 local_240;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  double local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  double local_168;
  double local_138;
  double local_e8;
  double local_b0;
  double local_68;
  int local_60;
  int local_4c;
  value_type local_48;
  int local_44;
  double local_40;
  double local_38;
  vector<particle_info,_std::allocator<particle_info>_> local_30;
  double local_18;
  
  local_18 = 5.067728853174532;
  std::vector<particle_info,_std::allocator<particle_info>_>::vector
            ((vector<particle_info,_std::allocator<particle_info>_> *)0x158337);
  local_38 = tanh(*(double *)(in_RDI + 0x248));
  local_40 = tanh(*(double *)(in_RDI + 0x240));
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x2cc); local_44 = local_44 + 1) {
    pvVar19 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_44);
    local_48 = *pvVar19;
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1583b9);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_44);
    local_4c = particleSamples::get_number_of_particles
                         (in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20))
    ;
    for (local_60 = 0; local_60 < local_4c; local_60 = local_60 + 1) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15841a);
      particleSamples::get_particle
                (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                 (int)in_stack_fffffffffffff878);
      local_68 = local_b0;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15845a);
      particleSamples::get_particle
                (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                 (int)in_stack_fffffffffffff878);
      local_e8 = local_138;
      local_168 = local_138 / local_68;
      if ((local_40 < local_168) && (local_168 < local_38)) {
        local_1b0 = local_68;
        local_1b8 = local_138;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15850d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_1c8 = local_240;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15854d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_1c0 = local_2b0;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15858d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_1d8 = local_340;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x1585cd);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_1a8 = local_388;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15860d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_1a0 = local_3f8;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15864d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_198 = local_468;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x15868d);
        particleSamples::get_particle
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20),
                   (int)in_stack_fffffffffffff878);
        local_190 = local_4d8;
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      }
    }
  }
  local_530 = std::vector<particle_info,_std::allocator<particle_info>_>::size(&local_30);
  local_538 = (long)(local_530 * (local_530 - 1)) / 2;
  pretty_ostream::operator<<
            ((pretty_ostream *)in_stack_fffffffffffff870,(char (*) [18])in_stack_fffffffffffff868);
  pretty_ostream::operator<<
            ((pretty_ostream *)in_stack_fffffffffffff870,
             (unsigned_long_long *)in_stack_fffffffffffff868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"info",&local_559);
  pretty_ostream::flush(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  dVar1 = *(double *)(in_RDI + 0x230);
  dVar2 = *(double *)(in_RDI + 0x230);
  dVar3 = *(double *)(in_RDI + 0x238);
  dVar4 = *(double *)(in_RDI + 0x238);
  local_574 = 0;
  do {
    if ((long)local_530 <= (long)local_574) {
      std::vector<particle_info,_std::allocator<particle_info>_>::clear
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x159b7d);
      std::vector<particle_info,_std::allocator<particle_info>_>::~vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)in_stack_fffffffffffff880)
      ;
      return;
    }
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar5 = pvVar20->px;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar6 = pvVar20->py;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar7 = pvVar20->pz;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar8 = pvVar20->E;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar9 = pvVar20->x;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar10 = pvVar20->y;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar11 = pvVar20->z;
    pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                        (&local_30,(long)local_574);
    dVar12 = pvVar20->t;
    local_5bc = local_574;
LAB_00158977:
    local_5bc = local_5bc + 1;
    if ((long)local_5bc < (long)local_530) {
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar25 = pvVar20->px;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar26 = pvVar20->py;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar27 = pvVar20->pz;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar28 = pvVar20->E;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar13 = pvVar20->x;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar14 = pvVar20->y;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar15 = pvVar20->z;
      pvVar20 = std::vector<particle_info,_std::allocator<particle_info>_>::operator[]
                          (&local_30,(long)local_5bc);
      dVar16 = pvVar20->t;
      dVar22 = (dVar7 + dVar27) * 0.5;
      dVar23 = (dVar8 + dVar28) * 0.5;
      __x = (dVar5 + dVar25) * 0.5;
      __y = (dVar6 + dVar26) * 0.5;
      dVar24 = __x * __x + __y * __y;
      if ((dVar1 * dVar2 <= dVar24) && (dVar24 <= dVar3 * dVar4)) {
        dVar24 = sqrt(dVar24);
        iVar18 = (int)((dVar24 - *(double *)(in_RDI + 0x230)) / *(double *)(in_RDI + 0x220));
        dVar25 = dVar5 - dVar25;
        dVar26 = dVar6 - dVar26;
        dVar27 = dVar7 - dVar27;
        dVar28 = dVar8 - dVar28;
        dVar29 = sqrt(-(-dVar27 * dVar27 + -dVar26 * dVar26 + dVar28 * dVar28 + -(dVar25 * dVar25)))
        ;
        this_00 = (pretty_ostream *)(dVar12 - dVar16);
        type = (string *)(dVar9 - dVar13);
        local_680 = dVar10 - dVar14;
        local_688 = dVar11 - dVar15;
        if ((*(int *)(in_RDI + 0x20c) == 1) &&
           (((pvVar21 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
                        operator[]((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    *)(in_RDI + 0x318),(long)iVar18),
             *pvVar21 < (ulong)(*(long *)(in_RDI + 0x2d0) * 0x32) &&
             ((*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0) + 1e-08 < dVar29))
            && (dVar29 < (*(double *)(in_RDI + 0x1f8) + *(double *)(in_RDI + 0x200) / 2.0) - 1e-08))
           )) {
          local_68c = (int)((dVar29 - (*(double *)(in_RDI + 0x1f0) -
                                      *(double *)(in_RDI + 0x200) / 2.0)) /
                           *(double *)(in_RDI + 0x200));
          pvVar21 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                               (in_RDI + 0x318),(long)iVar18);
          *pvVar21 = *pvVar21 + 1;
          local_698 = cos(local_18 *
                          (-dVar27 * local_688 +
                          -dVar26 * local_680 + dVar28 * (double)this_00 + -(dVar25 * (double)type))
                         );
          lVar17 = *(long *)(*(long *)(in_RDI + 0x370) + (long)iVar18 * 8);
          *(double *)(lVar17 + (long)local_68c * 8) =
               *(double *)(lVar17 + (long)local_68c * 8) + 1.0;
          lVar17 = *(long *)(*(long *)(in_RDI + 0x358) + (long)iVar18 * 8);
          *(double *)(lVar17 + (long)local_68c * 8) =
               dVar29 + *(double *)(lVar17 + (long)local_68c * 8);
          lVar17 = *(long *)(*(long *)(in_RDI + 0x360) + (long)iVar18 * 8);
          *(double *)(lVar17 + (long)local_68c * 8) =
               local_698 + *(double *)(lVar17 + (long)local_68c * 8);
        }
        local_6a0 = __x / dVar24;
        local_6a8 = __y / dVar24;
        local_6b0 = dVar25 * local_6a0 + dVar26 * local_6a8;
        if (((((*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0) + 1e-08 <=
               local_6b0) &&
             (local_6b0 <= (*(double *)(in_RDI + 0x1f8) + *(double *)(in_RDI + 0x200) / 2.0) - 1e-08
             )) && ((local_6b4 = (int)((local_6b0 -
                                       (*(double *)(in_RDI + 0x1f0) -
                                       *(double *)(in_RDI + 0x200) / 2.0)) /
                                      *(double *)(in_RDI + 0x200)),
                    local_6b4 < *(int *)(in_RDI + 0x1ec) &&
                    ((local_6c0 = dVar26 * local_6a0 + -(dVar25 * local_6a8),
                     (*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0) + 1e-08 <=
                     local_6c0 &&
                     (local_6c0 <=
                      (*(double *)(in_RDI + 0x1f8) + *(double *)(in_RDI + 0x200) / 2.0) - 1e-08)))))
            ) && (local_6c4 = (int)((local_6c0 -
                                    (*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0
                                    )) / *(double *)(in_RDI + 0x200)),
                 local_6c4 < *(int *)(in_RDI + 0x1ec))) {
          local_6d0 = dVar27;
          if ((*(byte *)(in_RDI + 0x1e8) & 1) != 0) {
            local_6d8 = sqrt(dVar23 * dVar23 + -(dVar22 * dVar22));
            local_6e0 = dVar23 / local_6d8;
            local_6d0 = local_6e0 * (-(dVar22 / dVar23) * dVar28 + dVar27);
            local_6e8 = dVar22 / dVar23;
          }
          if ((((*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0) + 1e-08 <=
                local_6d0) &&
              (local_6d0 <=
               (*(double *)(in_RDI + 0x1f8) + *(double *)(in_RDI + 0x200) / 2.0) - 1e-08)) &&
             (local_6ec = (int)((local_6d0 -
                                (*(double *)(in_RDI + 0x1f0) - *(double *)(in_RDI + 0x200) / 2.0)) /
                               *(double *)(in_RDI + 0x200)), local_6ec < *(int *)(in_RDI + 0x1ec)))
          {
            if (*(int *)(in_RDI + 0x208) == 0) {
              pvVar21 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
                        operator[]((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    *)(in_RDI + 0x2e8),(long)iVar18);
              if (*(ulong *)(in_RDI + 0x2d0) < *pvVar21) goto LAB_00158977;
              pvVar21 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
                        operator[]((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    *)(in_RDI + 0x2e8),(long)iVar18);
              *pvVar21 = *pvVar21 + 1;
            }
            else {
              local_6f8 = atan2(__y,__x);
              for (local_700 = local_6f8 - *(double *)(in_RDI + 0x210); local_700 < 0.0;
                  local_700 = local_700 + 6.283185307179586) {
              }
              for (; 6.283185307179586 < local_700; local_700 = local_700 - 6.283185307179586) {
              }
              local_6f0 = (int)(local_700 / *(double *)(in_RDI + 0x228));
              if ((local_6f0 < 0) || (*(int *)(in_RDI + 0x21c) <= local_6f0)) {
                pretty_ostream::operator<<
                          ((pretty_ostream *)in_stack_fffffffffffff870,
                           (char (*) [13])in_stack_fffffffffffff868);
                pretty_ostream::operator<<
                          ((pretty_ostream *)in_stack_fffffffffffff870,
                           (double *)in_stack_fffffffffffff868);
                in_stack_fffffffffffff880 =
                     (particleSamples *)
                     pretty_ostream::operator<<
                               ((pretty_ostream *)in_stack_fffffffffffff870,
                                in_stack_fffffffffffff868);
                pretty_ostream::operator<<
                          ((pretty_ostream *)in_stack_fffffffffffff870,
                           (char (*) [12])in_stack_fffffffffffff868);
                pretty_ostream::operator<<
                          ((pretty_ostream *)in_stack_fffffffffffff870,
                           (int *)in_stack_fffffffffffff868);
                in_stack_fffffffffffff868 = (char (*) [31])(in_RDI + 0x70);
                in_stack_fffffffffffff870 = (particleSamples *)local_721;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)(local_721 + 1),"warning",
                           (allocator *)in_stack_fffffffffffff870);
                pretty_ostream::flush(this_00,type);
                std::__cxx11::string::~string((string *)(local_721 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_721);
                goto LAB_00158977;
              }
              if (*(ulong *)(in_RDI + 0x2d0) <
                  *(ulong *)(*(long *)(*(long *)(in_RDI + 0x348) + (long)iVar18 * 8) +
                            (long)local_6f0 * 8)) goto LAB_00158977;
              lVar17 = *(long *)(*(long *)(in_RDI + 0x348) + (long)iVar18 * 8);
              *(long *)(lVar17 + (long)local_6f0 * 8) = *(long *)(lVar17 + (long)local_6f0 * 8) + 1;
            }
            dVar25 = cos(local_18 *
                         (-dVar27 * local_688 +
                         -dVar26 * local_680 + dVar28 * (double)this_00 + -(dVar25 * (double)type)))
            ;
            if (*(int *)(in_RDI + 0x208) == 0) {
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3a0) + (long)iVar18 * 8) +
                                          (long)local_6b4 * 8) + (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   *(double *)(lVar17 + (long)local_6ec * 8) + 1.0;
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x378) + (long)iVar18 * 8) +
                                          (long)local_6b4 * 8) + (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6b0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x380) + (long)iVar18 * 8) +
                                          (long)local_6b4 * 8) + (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6c0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x388) + (long)iVar18 * 8) +
                                          (long)local_6b4 * 8) + (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6d0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x390) + (long)iVar18 * 8) +
                                          (long)local_6b4 * 8) + (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   dVar25 + *(double *)(lVar17 + (long)local_6ec * 8);
            }
            else {
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3d0) +
                                                              (long)iVar18 * 8) +
                                                    (long)local_6f0 * 8) + (long)local_6b4 * 8) +
                                (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   *(double *)(lVar17 + (long)local_6ec * 8) + 1.0;
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3a8) +
                                                              (long)iVar18 * 8) +
                                                    (long)local_6f0 * 8) + (long)local_6b4 * 8) +
                                (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6b0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3b0) +
                                                              (long)iVar18 * 8) +
                                                    (long)local_6f0 * 8) + (long)local_6b4 * 8) +
                                (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6c0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3b8) +
                                                              (long)iVar18 * 8) +
                                                    (long)local_6f0 * 8) + (long)local_6b4 * 8) +
                                (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   local_6d0 + *(double *)(lVar17 + (long)local_6ec * 8);
              lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3c0) +
                                                              (long)iVar18 * 8) +
                                                    (long)local_6f0 * 8) + (long)local_6b4 * 8) +
                                (long)local_6c4 * 8);
              *(double *)(lVar17 + (long)local_6ec * 8) =
                   dVar25 + *(double *)(lVar17 + (long)local_6ec * 8);
            }
          }
        }
      }
      goto LAB_00158977;
    }
    local_574 = local_574 + 1;
  } while( true );
}

Assistant:

void HBT_correlation::combine_and_bin_particle_pairs(
    std::vector<int> event_list) {
    double hbarC_inv = 1. / hbarC;
    std::vector<particle_info> temp_particle_list;
    double particle_list_rapidity_cut_max = tanh(Krap_max_);
    double particle_list_rapidity_cut_min = tanh(Krap_min_);
    for (int j = 0; j < number_of_oversample_events_; j++) {
        int event_id = event_list[j];
        int event_number_particle =
            (particle_list->get_number_of_particles(event_list[j]));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_E = particle_list->get_particle(event_id, i).E;
            double temp_pz = particle_list->get_particle(event_id, i).pz;
            double temp_ratio = temp_pz / temp_E;
            if (temp_ratio > particle_list_rapidity_cut_min
                && temp_ratio < particle_list_rapidity_cut_max) {
                particle_info temp_particle;
                temp_particle.E = temp_E;
                temp_particle.pz = temp_pz;
                temp_particle.px = particle_list->get_particle(event_id, i).px;
                temp_particle.py = particle_list->get_particle(event_id, i).py;
                temp_particle.mass =
                    (particle_list->get_particle(event_id, i).mass);
                temp_particle.x = particle_list->get_particle(event_id, i).x;
                temp_particle.y = particle_list->get_particle(event_id, i).y;
                temp_particle.z = particle_list->get_particle(event_id, i).z;
                temp_particle.t = particle_list->get_particle(event_id, i).t;
                temp_particle_list.push_back(temp_particle);
            }
        }
    }
    long long int number_of_particles = temp_particle_list.size();
    unsigned long long int number_of_pairs =
        (number_of_particles * (number_of_particles - 1) / 2);

    // nested pair loop
    messager << "number of pairs: " << number_of_pairs;
    messager.flush("info");
    double KT_min_sq = KT_min * KT_min;
    double KT_max_sq = KT_max * KT_max;
    for (int i = 0; i < number_of_particles; i++) {
        double particle_1_px = temp_particle_list[i].px;
        double particle_1_py = temp_particle_list[i].py;
        double particle_1_pz = temp_particle_list[i].pz;
        double particle_1_E = temp_particle_list[i].E;
        double particle_1_x = temp_particle_list[i].x;
        double particle_1_y = temp_particle_list[i].y;
        double particle_1_z = temp_particle_list[i].z;
        double particle_1_t = temp_particle_list[i].t;

        for (int j = i + 1; j < number_of_particles; j++) {
            double particle_2_px = temp_particle_list[j].px;
            double particle_2_py = temp_particle_list[j].py;
            double particle_2_pz = temp_particle_list[j].pz;
            double particle_2_E = temp_particle_list[j].E;
            double particle_2_x = temp_particle_list[j].x;
            double particle_2_y = temp_particle_list[j].y;
            double particle_2_z = temp_particle_list[j].z;
            double particle_2_t = temp_particle_list[j].t;

            double K_z = 0.5 * (particle_1_pz + particle_2_pz);
            double K_E = 0.5 * (particle_1_E + particle_2_E);
            double K_z_over_K_E = K_z / K_E;

            // K_T cut
            double K_x = 0.5 * (particle_1_px + particle_2_px);
            double K_y = 0.5 * (particle_1_py + particle_2_py);
            double K_perp_sq = K_x * K_x + K_y * K_y;
            if (K_perp_sq < KT_min_sq || K_perp_sq > KT_max_sq) {
                continue;
            }

            double K_perp = sqrt(K_perp_sq);
            int Kperp_idx = static_cast<int>((K_perp - KT_min) / dKT);

            // calculate q_inv
            double q_x = particle_1_px - particle_2_px;
            double q_y = particle_1_py - particle_2_py;
            double q_z = particle_1_pz - particle_2_pz;
            double q_E = particle_1_E - particle_2_E;
            double local_q_inv =
                sqrt(-(q_E * q_E - q_x * q_x - q_y * q_y - q_z * q_z));

            double t_diff = particle_1_t - particle_2_t;
            double x_diff = particle_1_x - particle_2_x;
            double y_diff = particle_1_y - particle_2_y;
            double z_diff = particle_1_z - particle_2_z;

            if (invariant_radius_flag_ == 1) {
                if (number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]
                    < 50 * needed_number_of_pairs) {
                    if (local_q_inv > (q_min - delta_q / 2. + 1e-8)
                        && local_q_inv < (q_max + delta_q / 2. - 1e-8)) {
                        int qinv_idx = static_cast<int>(
                            (local_q_inv - (q_min - delta_q / 2.)) / delta_q);
                        number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]++;
                        double cos_qx =
                            cos(hbarC_inv
                                * (q_E * t_diff - q_x * x_diff - q_y * y_diff
                                   - q_z * z_diff));
                        correl_1d_inv_num_count[Kperp_idx][qinv_idx]++;
                        q_inv_mean[Kperp_idx][qinv_idx] += local_q_inv;
                        correl_1d_inv_num[Kperp_idx][qinv_idx] += cos_qx;
                    }
                }
            }

            // calculate qout and qside in lcms
            double cos_K_phi = K_x / K_perp;
            double sin_K_phi = K_y / K_perp;

            double local_q_out = q_x * cos_K_phi + q_y * sin_K_phi;
            if (local_q_out < (q_min - delta_q / 2. + 1e-8)
                || local_q_out > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qout_idx = static_cast<int>(
                (local_q_out - (q_min - delta_q / 2.)) / delta_q);
            if (qout_idx >= qnpts) continue;

            double local_q_side = q_y * cos_K_phi - q_x * sin_K_phi;
            if (local_q_side < (q_min - delta_q / 2. + 1e-8)
                || local_q_side > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qside_idx = static_cast<int>(
                (local_q_side - (q_min - delta_q / 2.)) / delta_q);
            if (qside_idx >= qnpts) continue;

            double local_q_long = q_z;
            if (long_comoving_boost) {
                // calcualte qlong in the lcms
                double Mt = sqrt(K_E * K_E - K_z * K_z);
                double boost_gamma = K_E / Mt;
                double boost_beta = K_z_over_K_E;
                // boost qz to lcms
                local_q_long = boost_gamma * (q_z - boost_beta * q_E);
            }

            if (local_q_long < (q_min - delta_q / 2. + 1e-8)
                || local_q_long > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }
            int qlong_idx = static_cast<int>(
                (local_q_long - (q_min - delta_q / 2.)) / delta_q);
            if (qlong_idx >= qnpts) continue;

            int Kphi_idx;
            if (azimuthal_flag_ == 0) {
                if (number_of_pairs_numerator_KTdiff[Kperp_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTdiff[Kperp_idx]++;
            } else {
                double local_K_phi = atan2(K_y, K_x);
                double delta_phi = local_K_phi - psi_ref;
                while (delta_phi < 0.) {
                    delta_phi += 2. * M_PI;
                }
                while (delta_phi > 2. * M_PI) {
                    delta_phi -= 2. * M_PI;
                }
                Kphi_idx = static_cast<int>(delta_phi / dKphi);
                if (Kphi_idx < 0 || Kphi_idx >= n_Kphi) {
                    messager << "delta_phi = " << delta_phi
                             << " is out of bound of [0, 2pi]! "
                             << "Kphi_idx = " << Kphi_idx;
                    messager.flush("warning");
                    continue;
                }
                if (number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]++;
            }

            double cos_qx = cos(
                hbarC_inv
                * (q_E * t_diff - q_x * x_diff - q_y * y_diff - q_z * z_diff));

            // bin results
            if (azimuthal_flag_ == 0) {
                correl_3d_num_count[Kperp_idx][qout_idx][qside_idx]
                                   [qlong_idx]++;
                q_out_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_out;
                q_side_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_side;
                q_long_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_long;
                correl_3d_num[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    cos_qx;
            } else {
                correl_3d_Kphi_diff_num_count[Kperp_idx][Kphi_idx][qout_idx]
                                             [qside_idx][qlong_idx]++;
                q_out_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                               [qlong_idx] += local_q_out;
                q_side_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_side;
                q_long_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_long;
                correl_3d_Kphi_diff_num[Kperp_idx][Kphi_idx][qout_idx]
                                       [qside_idx][qlong_idx] += cos_qx;
            }
        }
    }
    temp_particle_list.clear();
}